

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O2

char duckdb::SubtractOperatorOverflowCheck::Operation<signed_char,signed_char,signed_char>
               (char left,char right)

{
  char cVar1;
  int iVar2;
  OutOfRangeException *this;
  PhysicalType type;
  undefined7 in_register_00000031;
  undefined7 in_register_00000039;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  iVar2 = (int)CONCAT71(in_register_00000039,left) - (int)CONCAT71(in_register_00000031,right);
  cVar1 = (char)iVar2;
  if ((short)cVar1 == (short)iVar2) {
    return cVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Overflow in subtraction of %s (%s - %s)!",&local_99);
  TypeIdToString_abi_cxx11_(&local_58,(duckdb *)0x3,type);
  NumericHelper::ToString<signed_char>(&local_78,left);
  NumericHelper::ToString<signed_char>(&local_98,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_38,&local_58,&local_78,&local_98);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		return left - right;
	}